

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrypt_test.cc
# Opt level: O3

bool GetUint64(FileTest *t,uint64_t *out,char *name)

{
  bool bVar1;
  ulonglong uVar2;
  char *endptr;
  string str;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,name,&local_61);
  bVar1 = FileTest::GetAttribute(t,&local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (bVar1) {
    uVar2 = strtoull(local_40._M_dataplus._M_p,(char **)&local_60,10);
    *out = uVar2;
    if (local_40._M_string_length != 0) {
      bVar1 = *local_60._M_dataplus._M_p == '\0';
      goto LAB_0028ff18;
    }
  }
  bVar1 = false;
LAB_0028ff18:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return bVar1;
}

Assistant:

static bool GetUint64(FileTest *t, uint64_t *out, const char *name) {
  std::string str;
  if (!t->GetAttribute(&str, name)) {
    return false;
  }

  char *endptr;
  *out = strtoull(str.data(), &endptr, 10);
  return !str.empty() && *endptr == '\0';
}